

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  int iVar2;
  size_type sVar3;
  size_t sVar4;
  ostream *poVar5;
  Message env_var;
  string full_flag;
  char local_51;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48;
  
  Message::Message((Message *)&local_50);
  sVar1.ptr_ = local_50.ptr_;
  poVar5 = (ostream *)(local_50.ptr_ + 0x10);
  sVar4 = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gtest_",6);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar4 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)this,sVar4);
  StringStreamToString(&local_48,sVar1.ptr_);
  if (sVar1.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)sVar1.ptr_ + 8))(sVar1.ptr_);
    local_50.ptr_ = (stringstream *)0x0;
  }
  Message::Message((Message *)&local_50);
  if (local_48._M_string_length != 0) {
    poVar5 = (ostream *)(local_50.ptr_ + 0x10);
    sVar3 = 0;
    do {
      iVar2 = toupper((uint)(byte)local_48._M_dataplus._M_p[sVar3]);
      local_51 = (char)iVar2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_51,1);
      sVar3 = sVar3 + 1;
    } while (sVar3 != local_48._M_string_length);
  }
  sVar1.ptr_ = local_50.ptr_;
  StringStreamToString(__return_storage_ptr__,local_50.ptr_);
  if (sVar1.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)sVar1.ptr_ + 8))(sVar1.ptr_);
    local_50.ptr_ = (stringstream *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}